

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLABecLaplacian::setBCoeffs
          (MLABecLaplacian *this,int amrlev,Array<const_MultiFab_*,_3> *beta)

{
  int srccomp;
  int iVar1;
  const_reference ppMVar2;
  MultiFab *in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  int icomp_1;
  int idim_1;
  int icomp;
  int idim;
  int ncomp;
  char *in_stack_000001b8;
  int in_stack_000001c4;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  reference in_stack_ffffffffffffff98;
  array<amrex::MultiFab,_3UL> *in_stack_ffffffffffffffa0;
  int local_4c;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int numcomp;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  
  srccomp = (**(code **)(*in_RDI + 0x28))();
  ppMVar2 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                      ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffffa0,
                       (size_type)in_stack_ffffffffffffff98);
  iVar1 = FabArrayBase::nComp((FabArrayBase *)*ppMVar2);
  if (iVar1 != 1) {
    ppMVar2 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                        ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffffa0,
                         (size_type)in_stack_ffffffffffffff98);
    iVar1 = FabArrayBase::nComp((FabArrayBase *)*ppMVar2);
    if (iVar1 != srccomp) {
      Assert_host(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4,in_stack_000001b8);
    }
  }
  ppMVar2 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                      ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffffa0,
                       (size_type)in_stack_ffffffffffffff98);
  iVar1 = FabArrayBase::nComp((FabArrayBase *)*ppMVar2);
  if (iVar1 == srccomp) {
    for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
      for (numcomp = 0; numcomp < srccomp; numcomp = numcomp + 1) {
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa0 =
             (array<amrex::MultiFab,_3UL> *)
             std::array<amrex::MultiFab,_3UL>::operator[]
                       (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
        std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffffa0,
                   (size_type)in_stack_ffffffffffffff98);
        MultiFab::Copy((MultiFab *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_RDX,srccomp,iVar1,
                       numcomp,in_stack_ffffffffffffffb8);
      }
    }
  }
  else {
    for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
      for (local_4c = 0; local_4c < srccomp; local_4c = local_4c + 1) {
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
        in_stack_ffffffffffffff98 =
             std::array<amrex::MultiFab,_3UL>::operator[]
                       (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
        std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffffa0,
                   (size_type)in_stack_ffffffffffffff98);
        MultiFab::Copy((MultiFab *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_RDX,srccomp,
                       in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,iVar1);
      }
    }
  }
  *(undefined1 *)(in_RDI + 100) = 1;
  return;
}

Assistant:

void
MLABecLaplacian::setBCoeffs (int amrlev,
                             const Array<MultiFab const*,AMREX_SPACEDIM>& beta)
{
    const int ncomp = getNComp();
    AMREX_ALWAYS_ASSERT(beta[0]->nComp() == 1 || beta[0]->nComp() == ncomp);
    if (beta[0]->nComp() == ncomp)
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                MultiFab::Copy(m_b_coeffs[amrlev][0][idim], *beta[idim], icomp, icomp, 1, 0);
            }
        }
    else
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                MultiFab::Copy(m_b_coeffs[amrlev][0][idim], *beta[idim], 0, icomp, 1, 0);
            }
        }
    m_needs_update = true;
}